

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_trybinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  int iVar1;
  Value local_38;
  lua_Number dummy;
  StkId pTStack_28;
  TMS event_local;
  StkId res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  dummy._4_4_ = event;
  pTStack_28 = res;
  res_local = p2;
  p2_local = p1;
  p1_local = (TValue *)L;
  iVar1 = luaT_callbinTM(L,p1,p2,res,event);
  if (iVar1 != 0) {
    return;
  }
  if ((4 < dummy._4_4_ - TM_BAND) && (dummy._4_4_ != TM_BNOT)) {
    if (dummy._4_4_ != TM_CONCAT) {
      luaG_opinterror((lua_State *)p1_local,p2_local,res_local,"perform arithmetic on");
    }
    luaG_concaterror((lua_State *)p1_local,p2_local,res_local);
  }
  if (p2_local->tt_ == 3) {
    local_38 = p2_local->value_;
  }
  else {
    iVar1 = luaV_tonumber_(p2_local,&local_38.n);
    if (iVar1 == 0) goto LAB_0011beca;
  }
  if (res_local->tt_ == 3) {
    local_38 = res_local->value_;
  }
  else {
    iVar1 = luaV_tonumber_(res_local,&local_38.n);
    if (iVar1 == 0) {
LAB_0011beca:
      luaG_opinterror((lua_State *)p1_local,p2_local,res_local,"perform bitwise operation on");
    }
  }
  luaG_tointerror((lua_State *)p1_local,p2_local,res_local);
}

Assistant:

void luaT_trybinTM (lua_State *L, const TValue *p1, const TValue *p2,
                    StkId res, TMS event) {
  if (!luaT_callbinTM(L, p1, p2, res, event)) {
    switch (event) {
      case TM_CONCAT:
        luaG_concaterror(L, p1, p2);
      /* call never returns, but to avoid warnings: *//* FALLTHROUGH */
      case TM_BAND: case TM_BOR: case TM_BXOR:
      case TM_SHL: case TM_SHR: case TM_BNOT: {
        lua_Number dummy;
        if (tonumber(p1, &dummy) && tonumber(p2, &dummy))
          luaG_tointerror(L, p1, p2);
        else
          luaG_opinterror(L, p1, p2, "perform bitwise operation on");
      }
      /* calls never return, but to avoid warnings: *//* FALLTHROUGH */
      default:
        luaG_opinterror(L, p1, p2, "perform arithmetic on");
    }
  }
}